

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  int iVar5;
  uchar *puVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  uchar *puVar13;
  long in_FS_OFFSET;
  
  puVar3 = data;
  if (img_n != 4) {
    puVar3 = (uchar *)stbi__malloc_mad3(4,req_comp,x,0);
    if (puVar3 == (uchar *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -8) = "outofmem";
      puVar3 = (uchar *)0x0;
    }
    else {
      if (0 < (int)x) {
        uVar2 = img_n * 8 + 4;
        if ((0x1c < uVar2) || ((0x10101000U >> (uVar2 & 0x1f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-stb-image.h"
                        ,0x6fe,
                        "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                       );
        }
        uVar4 = 1;
        if (1 < (int)x) {
          uVar4 = (ulong)x;
        }
        iVar5 = req_comp + -1;
        uVar7 = 0;
        uVar8 = 0;
        uVar9 = 0;
        do {
          uVar12 = (ulong)uVar8;
          if (uVar2 == 0x14) {
            if (-1 < iVar5) {
              lVar10 = 0;
              iVar11 = req_comp;
              do {
                uVar1 = data[lVar10 + uVar7];
                puVar3[lVar10 * 2 + uVar12 + 2] = uVar1;
                puVar3[lVar10 * 2 + uVar12 + 1] = uVar1;
                puVar3[lVar10 * 2 + uVar12] = uVar1;
                puVar3[lVar10 * 2 + uVar12 + 3] = data[lVar10 + uVar7 + 1];
                iVar11 = iVar11 + -1;
                lVar10 = lVar10 + 2;
              } while (0 < iVar11);
            }
          }
          else if (uVar2 == 0x1c) {
            if (-1 < iVar5) {
              iVar11 = (int)uVar9 * req_comp;
              puVar6 = data + (uint)(iVar11 * img_n);
              puVar13 = puVar3 + (uint)(iVar11 * 4);
              iVar11 = req_comp;
              do {
                *puVar13 = *puVar6;
                puVar13[1] = puVar6[1];
                puVar13[2] = puVar6[2];
                puVar13[3] = 0xff;
                puVar6 = puVar6 + 3;
                puVar13 = puVar13 + 4;
                iVar11 = iVar11 + -1;
              } while (0 < iVar11);
            }
          }
          else if (-1 < iVar5) {
            lVar10 = 0;
            iVar11 = req_comp;
            do {
              uVar1 = data[lVar10 + uVar7];
              puVar3[lVar10 * 4 + uVar12 + 2] = uVar1;
              puVar3[lVar10 * 4 + uVar12 + 1] = uVar1;
              puVar3[lVar10 * 4 + uVar12] = uVar1;
              puVar3[lVar10 * 4 + uVar12 + 3] = 0xff;
              iVar11 = iVar11 + -1;
              lVar10 = lVar10 + 1;
            } while (0 < iVar11);
          }
          uVar9 = uVar9 + 1;
          uVar8 = uVar8 + req_comp * 4;
          uVar7 = (ulong)(uint)((int)uVar7 + req_comp * img_n);
        } while (uVar9 != uVar4);
      }
      free(data);
    }
  }
  return puVar3;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}